

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_linear_resampler_interpolate_frame_s16(ma_linear_resampler *pResampler,ma_int16 *pFrameOut)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)(pResampler->config).channels;
  uVar1 = (pResampler->inTimeFrac << 0xc) / (pResampler->config).sampleRateOut;
  if (uVar2 != 0) {
    if (uVar1 - 0x1000 != 0 && 0xfff < (int)uVar1) {
      __assert_fail("a <= (1<<shift)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x7f84,
                    "ma_int16 ma_linear_resampler_mix_s16(ma_int16, ma_int16, ma_int32, const ma_int32)"
                   );
    }
    uVar3 = 0;
    do {
      pFrameOut[uVar3] =
           (ma_int16)
           ((int)*(short *)((long)&pResampler->x1 + uVar3 * 2) * uVar1 +
            (int)*(short *)((long)&pResampler->x0 + uVar3 * 2) * -(uVar1 - 0x1000) >> 0xc);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

static void ma_linear_resampler_interpolate_frame_s16(ma_linear_resampler* pResampler, ma_int16* pFrameOut)
{
    ma_uint32 c;
    ma_uint32 a;
    const ma_uint32 shift = 12;

    MA_ASSERT(pResampler != NULL);
    MA_ASSERT(pFrameOut  != NULL);

    a = (pResampler->inTimeFrac << shift) / pResampler->config.sampleRateOut;

    for (c = 0; c < pResampler->config.channels; c += 1) {
        ma_int16 s = ma_linear_resampler_mix_s16(pResampler->x0.s16[c], pResampler->x1.s16[c], a, shift);
        pFrameOut[c] = s;
    }
}